

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O3

CStatementList * __thiscall IRT::CStatementList::CopyNotConst(CStatementList *this)

{
  CStatementList *pCVar1;
  pointer puVar2;
  ulong uVar3;
  _Head_base<0UL,_const_IRT::CStatement_*,_false> local_40;
  _Head_base<0UL,_const_IRT::CStatement_*,_false> local_38;
  
  pCVar1 = (CStatementList *)operator_new(0x20);
  (pCVar1->super_CStatement).super_IStatement.super_INode._vptr_INode =
       (_func_int **)&PTR_Accept_00181108;
  (pCVar1->statements).
  super__Vector_base<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::allocator<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pCVar1->statements).
  super__Vector_base<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::allocator<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pCVar1->statements).
  super__Vector_base<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::allocator<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar2 = (this->statements).
           super__Vector_base<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::allocator<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->statements).
      super__Vector_base<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::allocator<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != puVar2) {
    uVar3 = 0;
    do {
      (**(code **)((long)((puVar2[uVar3]._M_t.
                           super___uniq_ptr_impl<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>
                           .super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl)->
                         super_IStatement).super_INode + 0x18))(&local_38);
      local_40._M_head_impl = local_38._M_head_impl;
      local_38._M_head_impl = (CStatement *)0x0;
      std::
      vector<std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>,std::allocator<std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>>>
      ::
      emplace_back<std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>>
                ((vector<std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>,std::allocator<std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>>>
                  *)&pCVar1->statements,
                 (unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *)
                 &local_40);
      if (local_40._M_head_impl != (CStatement *)0x0) {
        (*((local_40._M_head_impl)->super_IStatement).super_INode._vptr_INode[2])();
      }
      local_40._M_head_impl = (CStatement *)0x0;
      if (local_38._M_head_impl != (CStatement *)0x0) {
        (*((local_38._M_head_impl)->super_IStatement).super_INode._vptr_INode[2])();
      }
      uVar3 = uVar3 + 1;
      puVar2 = (this->statements).
               super__Vector_base<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::allocator<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar3 < (ulong)((long)(this->statements).
                                   super__Vector_base<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::allocator<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 3));
  }
  return pCVar1;
}

Assistant:

CStatementList *CStatementList::CopyNotConst() const {
    CStatementList* list = new CStatementList();
    for (int i = 0; i < statements.size(); ++i) {
        list->Add(std::move(statements[i]->Copy()));
    }

    return list;
}